

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O1

void __thiscall wmj::fileWatcher::fileWatcher::~fileWatcher(fileWatcher *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  int __wd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_fileWatcher = (_func_int **)&PTR__fileWatcher_0011dd58;
  this->need_watching = false;
  __wd = inotify_add_watch(this->inotify_fd,(this->file_name)._M_dataplus._M_p,0xc0c);
  this->wd = __wd;
  inotify_rm_watch(this->inotify_fd,__wd);
  p_Var1 = (this->call_back_func).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->call_back_func,(_Any_data *)&this->call_back_func,
              __destroy_functor);
  }
  pcVar2 = (this->file_name)._M_dataplus._M_p;
  paVar3 = &(this->file_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

fileWatcher::~fileWatcher() {
    need_watching = false;
    startWatch();
    stopWatch();
}